

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ldst_multiple(DisasContext_conflict6 *ctx,uint32_t opc,int reglist,int base,int16_t offset)

{
  TCGContext_conflict6 *s;
  TCGArg a2;
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i64 addr;
  TCGv_i64 pTVar3;
  TCGv_i32 pTVar4;
  code *func;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  if ((ctx->hflags & 0x87f800) != 0) {
    generate_exception_err(ctx,0x14,0);
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)pTVar2 - (long)s);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  pTVar3 = tcg_const_i64_mips64el(s,(long)reglist);
  pTVar4 = tcg_const_i32_mips64el(s,ctx->mem_idx);
  a2 = (ctx->base).pc_next;
  tcg_ctx = ctx->uc->tcg_ctx;
  if (a2 != ctx->saved_pc) {
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),a2);
    ctx->saved_pc = (ctx->base).pc_next;
  }
  if (ctx->hflags != ctx->saved_hflags) {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->hflags + (long)tcg_ctx),
               (long)(int)ctx->hflags);
    ctx->saved_hflags = ctx->hflags;
    uVar1 = ctx->hflags & 0x803800;
    if (((uVar1 == 0x800) || (uVar1 == 0x1800)) || (uVar1 == 0x1000)) {
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->btarget + (long)tcg_ctx),ctx->btarget);
    }
  }
  switch(opc - 5 >> 1 | (uint)((opc - 5 & 1) != 0) << 0x1f) {
  case 0:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_lwm_mips64el;
    break;
  case 1:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_ldm_mips64el;
    break;
  default:
    goto LAB_009b0baa;
  case 4:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_swm_mips64el;
    break;
  case 5:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    func = helper_sdm_mips64el;
  }
  local_40 = pTVar4 + (long)&s->pool_cur;
  local_48 = pTVar3 + (long)&s->pool_cur;
  local_50 = (TCGv_i64)((long)s + (long)addr);
  tcg_gen_callN_mips64el(s,func,(TCGTemp *)0x0,4,&local_58);
LAB_009b0baa:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
  return;
}

Assistant:

static void gen_ldst_multiple(DisasContext *ctx, uint32_t opc, int reglist,
                              int base, int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;
    TCGv_i32 t2;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, t0, base, offset);

    t1 = tcg_const_tl(tcg_ctx, reglist);
    t2 = tcg_const_i32(tcg_ctx, ctx->mem_idx);

    save_cpu_state(ctx, 1);
    switch (opc) {
    case LWM32:
        gen_helper_lwm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SWM32:
        gen_helper_swm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#ifdef TARGET_MIPS64
    case LDM:
        gen_helper_ldm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SDM:
        gen_helper_sdm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}